

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint32_t __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::safe_size(SerialArenaChunk *this)

{
  uint uVar1;
  uint uVar2;
  SerialArenaChunkHeader *pSVar3;
  
  uVar2 = capacity(this);
  pSVar3 = header(this);
  uVar1 = (pSVar3->size).super___atomic_base<unsigned_int>._M_i;
  if (uVar1 < uVar2) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

uint32_t safe_size() const {
    return std::min(capacity(), size().load(std::memory_order_relaxed));
  }